

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_dedicated_threads::one_per_prio::private_dispatcher_t>,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t>
::unbind_agent(binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_dedicated_threads::one_per_prio::private_dispatcher_t>,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t>
               *this,environment_t *param_1,agent_ref_t *agent)

{
  proxy_dispatcher_t *disp;
  intrusive_ptr_t<so_5::agent_t> local_28;
  agent_ref_t *local_20;
  agent_ref_t *agent_local;
  environment_t *param_1_local;
  binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_dedicated_threads::one_per_prio::private_dispatcher_t>,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t,_so_5::disp::prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t>
  *this_local;
  
  disp = this->m_instance;
  local_20 = agent;
  agent_local = (agent_ref_t *)param_1;
  param_1_local = (environment_t *)this;
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(&local_28,agent);
  prio_dedicated_threads::one_per_prio::impl::binding_actions_mixin_t::do_unbind
            ((binding_actions_mixin_t *)this,(actual_disp_iface_t *)disp,&local_28);
  intrusive_ptr_t<so_5::agent_t>::~intrusive_ptr_t(&local_28);
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				this->do_unbind( m_instance, std::move( agent ) );
			}